

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

string * __thiscall
duckdb::QueryProfiler::RenderDisabledMessage_abi_cxx11_
          (string *__return_storage_ptr__,QueryProfiler *this,ProfilerPrintFormat format)

{
  yyjson_val_pool *pool;
  yyjson_mut_val *pyVar1;
  long lVar2;
  bool bVar3;
  yyjson_mut_doc *this_00;
  InternalException *this_01;
  uint *object;
  undefined7 in_register_00000011;
  ulong uVar4;
  yyjson_mut_val *pyVar5;
  char *pcVar6;
  yyjson_mut_doc *doc;
  allocator local_69;
  string local_68;
  string local_48;
  
  uVar4 = CONCAT71(in_register_00000011,format) & 0xffffffff;
  object = &switchD_0147612a::switchdataD_01ff3ee0;
  switch(uVar4) {
  case 0:
  case 2:
    pcVar6 = "Query profiling is disabled. Use \'PRAGMA enable_profiling;\' to enable profiling!";
    break;
  case 1:
    doc = (yyjson_mut_doc *)0x0;
    this_00 = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
    if (this_00 == (yyjson_mut_doc *)0x0) goto LAB_01476215;
    pool = &this_00->val_pool;
    doc = (yyjson_mut_doc *)(this_00->val_pool).cur;
    if ((yyjson_mut_doc *)(this_00->val_pool).end == doc) {
      bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,&this_00->alc,1);
      if (bVar3) {
        doc = (yyjson_mut_doc *)pool->cur;
        goto LAB_0147616c;
      }
    }
    else {
LAB_0147616c:
      object = (uint *)((yyjson_val_uni *)&doc->alc + 2);
      pool->cur = (yyjson_mut_val *)object;
      if (doc != (yyjson_mut_doc *)0x0) {
        doc->root = (yyjson_mut_val *)0x7;
        this_00->root = (yyjson_mut_val *)doc;
        if ((ulong)(((long)(this_00->val_pool).end - (long)object) / 0x18) < 2) {
          bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,&this_00->alc,2);
          if (!bVar3) goto LAB_01476215;
          object = (uint *)pool->cur;
          pool->cur = (yyjson_mut_val *)((long)object + 0x30);
          if ((yyjson_mut_val *)object == (yyjson_mut_val *)0x0) goto LAB_01476215;
        }
        else {
          pool->cur = (yyjson_mut_val *)&(doc->str_pool).chunks;
        }
        pyVar1 = doc->root;
        ((yyjson_mut_val *)object)->tag = 0x60d;
        (((yyjson_mut_val *)object)->uni).f64 = (double)"result";
        ((yyjson_mut_val *)((long)object + 0x18))->tag = 0x80d;
        (((yyjson_mut_val *)((long)object + 0x18))->uni).f64 = (double)"disabled";
        pyVar5 = (yyjson_mut_val *)object;
        if ((yyjson_mut_val *)0xff < pyVar1) {
          lVar2 = *(long *)(((yyjson_val_uni *)&doc->alc)->u64 + 0x10);
          pyVar5 = *(yyjson_mut_val **)(lVar2 + 0x10);
          *(uint **)(lVar2 + 0x10) = object;
        }
        ((yyjson_mut_val *)((long)object + 0x18))->next = pyVar5;
        ((yyjson_mut_val *)object)->next = (yyjson_mut_val *)((long)object + 0x18);
        ((yyjson_val_uni *)&doc->alc)->str = (char *)object;
        object = (uint *)(ulong)*(byte *)&doc->root;
        doc->root = (yyjson_mut_val *)
                    ((long)&((yyjson_mut_val *)((long)object + 0xf0))->next +
                    ((ulong)pyVar1 & 0xffffffffffffff00));
        goto LAB_01476215;
      }
    }
    this_00->root = (yyjson_mut_val *)0x0;
    doc = (yyjson_mut_doc *)0x0;
LAB_01476215:
    StringifyAndFree_abi_cxx11_
              (__return_storage_ptr__,(duckdb *)this_00,doc,(yyjson_mut_val *)object);
    return __return_storage_ptr__;
  case 3:
    pcVar6 = anon_var_dwarf_4b0ffdd + 9;
    break;
  case 4:
    pcVar6 = 
    "\n\t\t\t\t<!DOCTYPE html>\n                <html lang=\"en\"><head/><body>\n                  Query profiling is disabled. Use \'PRAGMA enable_profiling;\' to enable profiling!\n                </body></html>\n\t\t\t"
    ;
    break;
  case 5:
    pcVar6 = 
    "\n\t\t\t\tdigraph G {\n\t\t\t\t    node [shape=box, style=rounded, fontname=\"Courier New\", fontsize=10];\n\t\t\t\t    node_0_0 [label=\"Query profiling is disabled. Use \'PRAGMA enable_profiling;\' to enable profiling!\"];\n\t\t\t\t}\n\t\t\t"
    ;
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_68,"Unknown ProfilerPrintFormat \"%s\"",&local_69);
    EnumUtil::ToString<duckdb::ProfilerPrintFormat>(&local_48,(ProfilerPrintFormat)uVar4);
    InternalException::InternalException<std::__cxx11::string>(this_01,&local_68,&local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,(allocator *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::RenderDisabledMessage(ProfilerPrintFormat format) const {
	switch (format) {
	case ProfilerPrintFormat::NO_OUTPUT:
		return "";
	case ProfilerPrintFormat::QUERY_TREE:
	case ProfilerPrintFormat::QUERY_TREE_OPTIMIZER:
		return "Query profiling is disabled. Use 'PRAGMA enable_profiling;' to enable profiling!";
	case ProfilerPrintFormat::HTML:
		return R"(
				<!DOCTYPE html>
                <html lang="en"><head/><body>
                  Query profiling is disabled. Use 'PRAGMA enable_profiling;' to enable profiling!
                </body></html>
			)";
	case ProfilerPrintFormat::GRAPHVIZ:
		return R"(
				digraph G {
				    node [shape=box, style=rounded, fontname="Courier New", fontsize=10];
				    node_0_0 [label="Query profiling is disabled. Use 'PRAGMA enable_profiling;' to enable profiling!"];
				}
			)";
	case ProfilerPrintFormat::JSON: {
		auto doc = yyjson_mut_doc_new(nullptr);
		auto result_obj = yyjson_mut_obj(doc);
		yyjson_mut_doc_set_root(doc, result_obj);

		yyjson_mut_obj_add_str(doc, result_obj, "result", "disabled");
		return StringifyAndFree(doc, result_obj);
	}
	default:
		throw InternalException("Unknown ProfilerPrintFormat \"%s\"", EnumUtil::ToString(format));
	}
}